

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O1

int nn_dns_check_hostname(char *name,size_t namelen)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  
  if ((namelen - 0x100 < 0xffffffffffffff01) || (namelen == 0 || *name == '-')) {
    return -0x16;
  }
  sVar3 = 0;
  iVar4 = 0;
  do {
    bVar1 = name[sVar3];
    if (bVar1 == 0x2e) {
      bVar5 = iVar4 == 0;
      iVar4 = 0;
      if (bVar5) {
        return -0x16;
      }
    }
    else {
      if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x2d && (byte)(bVar1 - 0x3a) < 0xf6))
      {
        return -0x16;
      }
      if (0x3e < iVar4) {
        return -0x16;
      }
      iVar4 = iVar4 + 1;
    }
    sVar3 = sVar3 + 1;
    if (namelen == sVar3) {
      iVar2 = -0x16;
      if (iVar4 != 0) {
        iVar2 = 0;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

int nn_dns_check_hostname (const char *name, size_t namelen)
{
    int labelsz;

    /*  There has to be at least one label in the hostname.
        Additionally, hostnames are up to 255 characters long. */
    if (namelen < 1 || namelen > 255)
        return -EINVAL;

    /*  Hyphen can't be used as a first character of the hostname. */
    if (*name == '-')
        return -EINVAL;

    labelsz = 0;
    while (1) {

        /*  End of the hostname. */
        if (namelen == 0) {

            /*  The last label cannot be empty. */
            if (labelsz == 0)
                return -EINVAL;

            /*  Success! */
            return 0;
        }

        /*  End of a label. */
        if (*name == '.') {

            /*  The old label cannot be empty. */
            if (labelsz == 0)
                return -EINVAL;

            /*  Start new label. */
            labelsz = 0;
            ++name;
            --namelen;
            continue;
        }

        /*  Valid character. */
        if ((*name >= 'a' && *name <= 'z') ||
              (*name >= 'A' && *name <= 'Z') ||
              (*name >= '0' && *name <= '9') ||
              *name == '-') {
            ++name;
            --namelen;
            ++labelsz;

            /*  Labels longer than 63 charcters are not permitted. */
            if (labelsz > 63)
                return -EINVAL;

            continue;
        }

        /*  Invalid character. */
        return -EINVAL;
    }
}